

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SilentEntitySystem.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::SilentEntitySystem::SetEntityAppearanceList
          (SilentEntitySystem *this,
          vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
          *EA)

{
  size_type sVar1;
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
  *local_18;
  vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
  *EA_local;
  SilentEntitySystem *this_local;
  
  local_18 = EA;
  EA_local = (vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
              *)this;
  sVar1 = std::
          vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
          ::size(EA);
  if (this->m_ui16NumEnts <= sVar1) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"SetEntityAppearanceList",&local_39);
    KException::KException(this_00,&local_38,7);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  std::vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
  ::operator=(&this->m_vEA,local_18);
  sVar1 = std::
          vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
          ::size(&this->m_vEA);
  this->m_ui16NumOfAppearanceRecords = (KUINT16)sVar1;
  return;
}

Assistant:

void SilentEntitySystem::SetEntityAppearanceList(const vector<EntityAppearance> &EA) noexcept(false)
{
    if( EA.size() >= m_ui16NumEnts )throw KException( __FUNCTION__, OUT_OF_BOUNDS );

    m_vEA = EA;
    m_ui16NumOfAppearanceRecords = m_vEA.size();
}